

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkMemUtil.cpp
# Opt level: O1

MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> * __thiscall
vk::SimpleAllocator::allocate
          (MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *__return_storage_ptr__,
          SimpleAllocator *this,VkMemoryRequirements *memReqs,MemoryRequirement requirement)

{
  uint uVar1;
  Handle<(vk::HandleType)7> HVar2;
  DeviceInterface *pDVar3;
  VkDevice pVVar4;
  VkAllocationCallbacks *pVVar5;
  ulong uVar6;
  NotSupportedError *this_00;
  HostPtr *this_01;
  Allocation *pAVar7;
  ulong uVar8;
  void *pvVar9;
  ulong in_R9;
  bool bVar10;
  MovePtr<vk::(anonymous_namespace)::HostPtr,_de::DefaultDeleter<vk::(anonymous_namespace)::HostPtr>_>
  hostPtr;
  Move<vk::Handle<(vk::HandleType)7>_> mem;
  VkMemoryAllocateInfo allocInfo;
  HostPtr *pHVar11;
  Move<vk::Handle<(vk::HandleType)7>_> local_88;
  UniqueBase<vk::(anonymous_namespace)::HostPtr,_de::DefaultDeleter<vk::(anonymous_namespace)::HostPtr>_>
  local_60;
  UniqueBase<vk::(anonymous_namespace)::HostPtr,_de::DefaultDeleter<vk::(anonymous_namespace)::HostPtr>_>
  local_50;
  VkMemoryAllocateInfo local_40;
  
  uVar8 = (ulong)(this->m_memProps).memoryTypeCount;
  if (uVar8 != 0) {
    bVar10 = true;
    uVar6 = 0;
    do {
      local_40.memoryTypeIndex = (deUint32)uVar6;
      if (((((memReqs->memoryTypeBits >> (local_40.memoryTypeIndex & 0x1f) & 1) != 0) &&
           ((uVar1 = (this->m_memProps).memoryTypes[uVar6].propertyFlags,
            (requirement.m_flags & 1) == 0 || (in_R9 = (ulong)(uVar1 & 2), (uVar1 & 2) != 0)))) &&
          (((requirement.m_flags & 2) == 0 || (in_R9 = (ulong)(uVar1 & 4), (uVar1 & 4) != 0)))) &&
         (((requirement.m_flags & 4) == 0 || ((uVar1 & 0x10) != 0)))) {
        if (bVar10) {
          local_40.sType = VK_STRUCTURE_TYPE_MEMORY_ALLOCATE_INFO;
          local_40.pNext = (void *)0x0;
          local_40.allocationSize = memReqs->size;
          allocateMemory(&local_88,this->m_vk,this->m_device,&local_40,(VkAllocationCallbacks *)0x0)
          ;
          pHVar11 = (HostPtr *)0x0;
          this_01 = pHVar11;
          if ((requirement.m_flags & 1) != 0) {
            this_01 = (HostPtr *)operator_new(0x20);
            anon_unknown_6::HostPtr::HostPtr
                      (this_01,this->m_vk,this->m_device,
                       (VkDeviceMemory)
                       local_88.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.
                       m_internal,local_40.allocationSize,in_R9,(VkMemoryMapFlags)pHVar11);
            local_60.m_data.ptr = (HostPtr *)0x0;
            de::details::
            UniqueBase<vk::(anonymous_namespace)::HostPtr,_de::DefaultDeleter<vk::(anonymous_namespace)::HostPtr>_>
            ::reset((UniqueBase<vk::(anonymous_namespace)::HostPtr,_de::DefaultDeleter<vk::(anonymous_namespace)::HostPtr>_>
                     *)&stack0xffffffffffffff48);
            de::details::
            UniqueBase<vk::(anonymous_namespace)::HostPtr,_de::DefaultDeleter<vk::(anonymous_namespace)::HostPtr>_>
            ::reset(&local_60);
          }
          pAVar7 = (Allocation *)operator_new(0x50);
          pVVar5 = local_88.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_allocator
          ;
          pVVar4 = local_88.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_device;
          pDVar3 = local_88.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.
                   m_deviceIface;
          HVar2.m_internal =
               local_88.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.m_internal;
          local_88.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.m_internal = 0;
          local_88.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_deviceIface =
               (DeviceInterface *)0x0;
          local_88.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_device =
               (VkDevice)0x0;
          local_88.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_allocator =
               (VkAllocationCallbacks *)0x0;
          if (this_01 == (HostPtr *)0x0) {
            pvVar9 = (void *)0x0;
          }
          else {
            pvVar9 = this_01->m_ptr;
          }
          (pAVar7->m_memory).m_internal = HVar2.m_internal;
          pAVar7->m_offset = 0;
          pAVar7->m_hostPtr = pvVar9;
          pAVar7->_vptr_Allocation = (_func_int **)&PTR__SimpleAllocation_00d49c18;
          pAVar7[1].m_offset = (VkDeviceSize)pVVar4;
          pAVar7[1].m_hostPtr = pVVar5;
          pAVar7[1]._vptr_Allocation = (_func_int **)HVar2.m_internal;
          pAVar7[1].m_memory.m_internal = (deUint64)pDVar3;
          local_50.m_data.ptr = (HostPtr *)0x0;
          pAVar7[2]._vptr_Allocation = (_func_int **)this_01;
          (__return_storage_ptr__->
          super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>).m_data.ptr = pAVar7
          ;
          de::details::
          UniqueBase<vk::(anonymous_namespace)::HostPtr,_de::DefaultDeleter<vk::(anonymous_namespace)::HostPtr>_>
          ::reset(&local_50);
          de::details::
          UniqueBase<vk::(anonymous_namespace)::HostPtr,_de::DefaultDeleter<vk::(anonymous_namespace)::HostPtr>_>
          ::reset((UniqueBase<vk::(anonymous_namespace)::HostPtr,_de::DefaultDeleter<vk::(anonymous_namespace)::HostPtr>_>
                   *)&stack0xffffffffffffff48);
          if (local_88.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.m_internal != 0)
          {
            refdetails::Deleter<vk::Handle<(vk::HandleType)7>_>::operator()
                      (&local_88.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter,
                       (VkDeviceMemory)
                       local_88.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.
                       m_internal);
          }
          return __return_storage_ptr__;
        }
        break;
      }
      uVar6 = uVar6 + 1;
      bVar10 = uVar6 < uVar8;
    } while (uVar6 != uVar8);
  }
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this_00,"No compatible memory type found",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/framework/vulkan/vkMemUtil.cpp"
             ,0x57);
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

MovePtr<Allocation> SimpleAllocator::allocate (const VkMemoryRequirements& memReqs, MemoryRequirement requirement)
{
	const deUint32				memoryTypeNdx	= selectMatchingMemoryType(m_memProps, memReqs.memoryTypeBits, requirement);
	const VkMemoryAllocateInfo	allocInfo		=
	{
		VK_STRUCTURE_TYPE_MEMORY_ALLOCATE_INFO,	//	VkStructureType			sType;
		DE_NULL,								//	const void*				pNext;
		memReqs.size,							//	VkDeviceSize			allocationSize;
		memoryTypeNdx,							//	deUint32				memoryTypeIndex;
	};

	Move<VkDeviceMemory>		mem				= allocateMemory(m_vk, m_device, &allocInfo);
	MovePtr<HostPtr>			hostPtr;

	if (requirement & MemoryRequirement::HostVisible)
	{
		DE_ASSERT(isHostVisibleMemory(m_memProps, allocInfo.memoryTypeIndex));
		hostPtr = MovePtr<HostPtr>(new HostPtr(m_vk, m_device, *mem, 0u, allocInfo.allocationSize, 0u));
	}

	return MovePtr<Allocation>(new SimpleAllocation(mem, hostPtr));
}